

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::LineGeometry::LineGeometry
          (LineGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Scope *pSVar1;
  Element *pEVar2;
  allocator<char> local_c9;
  string local_c8;
  Element *local_a8;
  Element *PointsIndex;
  string local_98;
  Element *local_78;
  Element *Points;
  string local_68;
  Scope *local_38;
  Scope *sc;
  Document *doc_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  LineGeometry *this_local;
  
  sc = (Scope *)doc;
  doc_local = (Document *)name;
  name_local = (string *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__LineGeometry_0100d100;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_vertices);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_indices);
  pSVar1 = Element::Compound((Element *)name_local);
  local_38 = pSVar1;
  if (pSVar1 == (Scope *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "failed to read Geometry object (class: Line), no data scope found",
               (allocator<char> *)((long)&Points + 7));
    Util::DOMError(&local_68,(Element *)0x0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Points",(allocator<char> *)((long)&PointsIndex + 7));
  pEVar2 = GetRequiredElement(pSVar1,&local_98,(Element *)name_local);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&PointsIndex + 7));
  pSVar1 = local_38;
  local_78 = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"PointsIndex",&local_c9);
  pEVar2 = GetRequiredElement(pSVar1,&local_c8,(Element *)name_local);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_a8 = pEVar2;
  ParseVectorDataArray(&this->m_vertices,local_78);
  ParseVectorDataArray(&this->m_indices,local_a8);
  return;
}

Assistant:

LineGeometry::LineGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
    : Geometry(id, element, name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Line), no data scope found");
    }
    const Element& Points = GetRequiredElement(*sc, "Points", &element);
    const Element& PointsIndex = GetRequiredElement(*sc, "PointsIndex", &element);
    ParseVectorDataArray(m_vertices, Points);
    ParseVectorDataArray(m_indices, PointsIndex);
}